

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_> *
kj::_::HeapArrayDisposer::allocate<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>>>
          (size_t count)

{
  Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_> *pMVar1;
  size_t count_local;
  
  pMVar1 = (Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_> *)
           allocateImpl(0x28,count,count,
                        Allocate_<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_>::
                        construct,
                        ArrayDisposer::
                        Dispose_<kj::Maybe<capnp::Orphan<capnp::compiler::Declaration::Param>_>_>::
                        destruct);
  return pMVar1;
}

Assistant:

T* HeapArrayDisposer::allocate(size_t count) {
  if constexpr (KJ_HAS_TRIVIAL_CONSTRUCTOR(T)) {
    return reinterpret_cast<T*>(allocateImpl(sizeof(T), count, count, nullptr, nullptr));
  } else if (KJ_HAS_NOTHROW_CONSTRUCTOR(T)) {
    return reinterpret_cast<T*>(allocateImpl(
      sizeof(T), count, count, &Allocate_<T>::construct, nullptr));
  } else {
    return reinterpret_cast<T*>(allocateImpl(
      sizeof(T), count, count, &Allocate_<T>::construct, &Dispose_<T>::destruct));
  }
}